

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O1

void __thiscall cppnet::Dispatcher::DoTask(Dispatcher *this)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> func_vec;
  unique_lock<std::mutex> lock;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_38;
  unique_lock<std::mutex> local_20;
  
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20._M_device = &this->_task_list_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  pfVar1 = (this->_task_list).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->_task_list).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pfVar3 = (this->_task_list).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = pfVar1;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pfVar2;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pfVar3;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  if (local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (*(long *)((long)&((local_38.
                             super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                           _M_manager + lVar5) == 0) {
        uVar4 = std::__throw_bad_function_call();
        std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                  (&local_38);
        _Unwind_Resume(uVar4);
      }
      (**(code **)((long)&(local_38.
                           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_invoker + lVar5))
                ((long)&((local_38.
                          super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                        _M_functor + lVar5);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 < (ulong)((long)local_38.
                                   super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.
                                   super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_38);
  return;
}

Assistant:

void Dispatcher::DoTask() {
    std::vector<Task> func_vec;
    {
        std::unique_lock<std::mutex> lock(_task_list_mutex);
        func_vec.swap(_task_list);
    }

    for (std::size_t i = 0; i < func_vec.size(); ++i) {
        func_vec[i]();
    }
}